

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O3

QDataStream * operator<<(QDataStream *s,QRect *r)

{
  qint32 i;
  QDataStream *pQVar1;
  
  i = (r->x1).m_i;
  if (s->ver == 1) {
    pQVar1 = QDataStream::operator<<(s,(qint16)i);
    pQVar1 = QDataStream::operator<<(pQVar1,(qint16)(r->y1).m_i);
    pQVar1 = QDataStream::operator<<(pQVar1,(qint16)(r->x2).m_i);
    QDataStream::operator<<(pQVar1,(qint16)(r->y2).m_i);
  }
  else {
    pQVar1 = QDataStream::operator<<(s,i);
    pQVar1 = QDataStream::operator<<(pQVar1,(r->y1).m_i);
    pQVar1 = QDataStream::operator<<(pQVar1,(r->x2).m_i);
    QDataStream::operator<<(pQVar1,(r->y2).m_i);
  }
  return s;
}

Assistant:

QDataStream &operator<<(QDataStream &s, const QRect &r)
{
    if (s.version() == 1)
        s << (qint16)r.left() << (qint16)r.top()
          << (qint16)r.right() << (qint16)r.bottom();
    else
        s << (qint32)r.left() << (qint32)r.top()
          << (qint32)r.right() << (qint32)r.bottom();
    return s;
}